

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg.cpp
# Opt level: O2

void common_params_print_completion(common_params_context *ctx_arg)

{
  pointer pcVar1;
  bool bVar2;
  _Base_ptr p_Var3;
  long lVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  common_arg *opt;
  pointer this;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  allocator_type local_5e2;
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_5e1;
  allocator<char> local_5e0;
  allocator<char> local_5df;
  allocator<char> local_5de;
  allocator<char> local_5dd;
  allocator<char> local_5dc;
  allocator<char> local_5db;
  allocator<char> local_5da;
  allocator<char> local_5d9;
  allocator<char> local_5d8;
  allocator<char> local_5d7;
  allocator<char> local_5d6;
  allocator<char> local_5d5;
  allocator<char> local_5d4;
  allocator<char> local_5d3;
  allocator<char> local_5d2;
  allocator<char> local_5d1;
  allocator<char> local_5d0;
  allocator<char> local_5cf;
  allocator<char> local_5ce;
  allocator<char> local_5cd;
  allocator<char> local_5cc;
  allocator<char> local_5cb;
  allocator<char> local_5ca;
  allocator<char> local_5c9;
  allocator<char> local_5c8;
  allocator<char> local_5c7;
  allocator<char> local_5c6;
  allocator<char> local_5c5;
  allocator<char> local_5c4;
  allocator<char> local_5c3;
  allocator<char> local_5c2;
  allocator<char> local_5c1;
  allocator<char> local_5c0;
  allocator<char> local_5bf;
  allocator<char> local_5be;
  allocator<char> local_5bd;
  allocator<char> local_5bc;
  allocator<char> local_5bb;
  allocator<char> local_5ba;
  allocator<char> local_5b9;
  vector<common_arg_*,_std::allocator<common_arg_*>_> common_options;
  vector<common_arg_*,_std::allocator<common_arg_*>_> specific_options;
  vector<common_arg_*,_std::allocator<common_arg_*>_> sparam_options;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  executables;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_530;
  string local_510 [32];
  string local_4f0 [32];
  string local_4d0 [32];
  string local_4b0 [32];
  string local_490 [32];
  string local_470 [32];
  string local_450 [32];
  string local_430 [32];
  string local_410 [32];
  string local_3f0 [32];
  string local_3d0 [32];
  string local_3b0 [32];
  string local_390 [32];
  string local_370 [32];
  string local_350 [32];
  string local_330 [32];
  string local_310 [32];
  string local_2f0 [32];
  string local_2d0 [32];
  string local_2b0 [32];
  string local_290 [32];
  string local_270 [32];
  string local_250 [32];
  string local_230 [32];
  string local_210 [32];
  string local_1f0 [32];
  string local_1d0 [32];
  string local_1b0 [32];
  string local_190 [32];
  string local_170 [32];
  string local_150 [32];
  string local_130 [32];
  string local_110 [32];
  string local_f0 [32];
  string local_d0 [32];
  string local_b0 [32];
  string local_90 [32];
  string local_70 [32];
  string local_50 [32];
  
  common_options.super__Vector_base<common_arg_*,_std::allocator<common_arg_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  common_options.super__Vector_base<common_arg_*,_std::allocator<common_arg_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  common_options.super__Vector_base<common_arg_*,_std::allocator<common_arg_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  sparam_options.super__Vector_base<common_arg_*,_std::allocator<common_arg_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  sparam_options.super__Vector_base<common_arg_*,_std::allocator<common_arg_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  sparam_options.super__Vector_base<common_arg_*,_std::allocator<common_arg_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  specific_options.super__Vector_base<common_arg_*,_std::allocator<common_arg_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  specific_options.super__Vector_base<common_arg_*,_std::allocator<common_arg_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  specific_options.super__Vector_base<common_arg_*,_std::allocator<common_arg_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  pcVar1 = (ctx_arg->options).super__Vector_base<common_arg,_std::allocator<common_arg>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (this = (ctx_arg->options).super__Vector_base<common_arg,_std::allocator<common_arg>_>._M_impl
              .super__Vector_impl_data._M_start; this != pcVar1; this = this + 1) {
    in_RSI = &local_530;
    if (this->is_sparam == true) {
      local_530._M_dataplus._M_p = (pointer)this;
      std::vector<common_arg*,std::allocator<common_arg*>>::emplace_back<common_arg*>
                ((vector<common_arg*,std::allocator<common_arg*>> *)&sparam_options,
                 (common_arg **)&local_530);
    }
    else {
      bVar2 = common_arg::in_example(this,ctx_arg->ex);
      if (bVar2) {
        local_530._M_dataplus._M_p = (pointer)this;
        std::vector<common_arg*,std::allocator<common_arg*>>::emplace_back<common_arg*>
                  ((vector<common_arg*,std::allocator<common_arg*>> *)&specific_options,
                   (common_arg **)&local_530);
      }
      else {
        local_530._M_dataplus._M_p = (pointer)this;
        std::vector<common_arg*,std::allocator<common_arg*>>::emplace_back<common_arg*>
                  ((vector<common_arg*,std::allocator<common_arg*>> *)&common_options,
                   (common_arg **)&local_530);
      }
    }
  }
  puts("_llama_completions() {");
  puts("    local cur prev opts");
  puts("    COMPREPLY=()");
  puts("    cur=\"${COMP_WORDS[COMP_CWORD]}\"");
  puts("    prev=\"${COMP_WORDS[COMP_CWORD-1]}\"\n");
  printf("    opts=\"");
  common_params_print_completion::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)&common_options,
             (vector<common_arg_*,_std::allocator<common_arg_*>_> *)in_RSI);
  common_params_print_completion::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)&sparam_options,
             (vector<common_arg_*,_std::allocator<common_arg_*>_> *)in_RSI);
  common_params_print_completion::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)&specific_options,
             (vector<common_arg_*,_std::allocator<common_arg_*>_> *)in_RSI);
  puts("\"\n");
  puts("    case \"$prev\" in");
  puts("        --model)");
  puts(
      "            COMPREPLY=( $(compgen -f -X \'!*.gguf\' -- \"$cur\") $(compgen -d -- \"$cur\") )"
      );
  puts("            return 0");
  puts("            ;;");
  puts("        --grammar-file)");
  puts(
      "            COMPREPLY=( $(compgen -f -X \'!*.gbnf\' -- \"$cur\") $(compgen -d -- \"$cur\") )"
      );
  puts("            return 0");
  puts("            ;;");
  puts("        --chat-template-file)");
  puts(
      "            COMPREPLY=( $(compgen -f -X \'!*.jinja\' -- \"$cur\") $(compgen -d -- \"$cur\") )"
      );
  puts("            return 0");
  puts("            ;;");
  puts("        *)");
  puts("            COMPREPLY=( $(compgen -W \"${opts}\" -- \"$cur\") )");
  puts("            return 0");
  puts("            ;;");
  puts("    esac");
  puts("}\n");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_530,"llama-batched",&local_5b9);
  std::__cxx11::string::string<std::allocator<char>>(local_510,"llama-batched-bench",&local_5ba);
  std::__cxx11::string::string<std::allocator<char>>(local_4f0,"llama-bench",&local_5bb);
  std::__cxx11::string::string<std::allocator<char>>(local_4d0,"llama-cli",&local_5bc);
  std::__cxx11::string::string<std::allocator<char>>
            (local_4b0,"llama-convert-llama2c-to-ggml",&local_5bd);
  std::__cxx11::string::string<std::allocator<char>>(local_490,"llama-cvector-generator",&local_5be)
  ;
  std::__cxx11::string::string<std::allocator<char>>(local_470,"llama-embedding",&local_5bf);
  std::__cxx11::string::string<std::allocator<char>>(local_450,"llama-eval-callback",&local_5c0);
  std::__cxx11::string::string<std::allocator<char>>(local_430,"llama-export-lora",&local_5c1);
  std::__cxx11::string::string<std::allocator<char>>(local_410,"llama-gen-docs",&local_5c2);
  std::__cxx11::string::string<std::allocator<char>>(local_3f0,"llama-gguf",&local_5c3);
  std::__cxx11::string::string<std::allocator<char>>(local_3d0,"llama-gguf-hash",&local_5c4);
  std::__cxx11::string::string<std::allocator<char>>(local_3b0,"llama-gguf-split",&local_5c5);
  std::__cxx11::string::string<std::allocator<char>>(local_390,"llama-gritlm",&local_5c6);
  std::__cxx11::string::string<std::allocator<char>>(local_370,"llama-imatrix",&local_5c7);
  std::__cxx11::string::string<std::allocator<char>>(local_350,"llama-infill",&local_5c8);
  std::__cxx11::string::string<std::allocator<char>>(local_330,"llama-mtmd-cli",&local_5c9);
  std::__cxx11::string::string<std::allocator<char>>
            (local_310,"llama-llava-clip-quantize-cli",&local_5ca);
  std::__cxx11::string::string<std::allocator<char>>(local_2f0,"llama-lookahead",&local_5cb);
  std::__cxx11::string::string<std::allocator<char>>(local_2d0,"llama-lookup",&local_5cc);
  std::__cxx11::string::string<std::allocator<char>>(local_2b0,"llama-lookup-create",&local_5cd);
  std::__cxx11::string::string<std::allocator<char>>(local_290,"llama-lookup-merge",&local_5ce);
  std::__cxx11::string::string<std::allocator<char>>(local_270,"llama-lookup-stats",&local_5cf);
  std::__cxx11::string::string<std::allocator<char>>(local_250,"llama-parallel",&local_5d0);
  std::__cxx11::string::string<std::allocator<char>>(local_230,"llama-passkey",&local_5d1);
  std::__cxx11::string::string<std::allocator<char>>(local_210,"llama-perplexity",&local_5d2);
  std::__cxx11::string::string<std::allocator<char>>(local_1f0,"llama-q8dot",&local_5d3);
  std::__cxx11::string::string<std::allocator<char>>(local_1d0,"llama-quantize",&local_5d4);
  std::__cxx11::string::string<std::allocator<char>>(local_1b0,"llama-qwen2vl-cli",&local_5d5);
  std::__cxx11::string::string<std::allocator<char>>(local_190,"llama-retrieval",&local_5d6);
  std::__cxx11::string::string<std::allocator<char>>(local_170,"llama-run",&local_5d7);
  std::__cxx11::string::string<std::allocator<char>>(local_150,"llama-save-load-state",&local_5d8);
  std::__cxx11::string::string<std::allocator<char>>(local_130,"llama-server",&local_5d9);
  std::__cxx11::string::string<std::allocator<char>>(local_110,"llama-simple",&local_5da);
  std::__cxx11::string::string<std::allocator<char>>(local_f0,"llama-simple-chat",&local_5db);
  std::__cxx11::string::string<std::allocator<char>>(local_d0,"llama-speculative",&local_5dc);
  std::__cxx11::string::string<std::allocator<char>>(local_b0,"llama-speculative-simple",&local_5dd)
  ;
  std::__cxx11::string::string<std::allocator<char>>(local_90,"llama-tokenize",&local_5de);
  std::__cxx11::string::string<std::allocator<char>>(local_70,"llama-tts",&local_5df);
  std::__cxx11::string::string<std::allocator<char>>(local_50,"llama-vdot",&local_5e0);
  __l._M_len = 0x28;
  __l._M_array = &local_530;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set(&executables,__l,&local_5e1,&local_5e2);
  lVar4 = 0x4e0;
  do {
    std::__cxx11::string::~string((string *)((long)&local_530._M_dataplus._M_p + lVar4));
    lVar4 = lVar4 + -0x20;
  } while (lVar4 != -0x20);
  for (p_Var3 = executables._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var3 != &executables._M_t._M_impl.super__Rb_tree_header;
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
    printf("complete -F _llama_completions %s\n",*(undefined8 *)(p_Var3 + 1));
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&executables._M_t);
  std::_Vector_base<common_arg_*,_std::allocator<common_arg_*>_>::~_Vector_base
            (&specific_options.super__Vector_base<common_arg_*,_std::allocator<common_arg_*>_>);
  std::_Vector_base<common_arg_*,_std::allocator<common_arg_*>_>::~_Vector_base
            (&sparam_options.super__Vector_base<common_arg_*,_std::allocator<common_arg_*>_>);
  std::_Vector_base<common_arg_*,_std::allocator<common_arg_*>_>::~_Vector_base
            (&common_options.super__Vector_base<common_arg_*,_std::allocator<common_arg_*>_>);
  return;
}

Assistant:

static void common_params_print_completion(common_params_context & ctx_arg) {
    std::vector<common_arg *> common_options;
    std::vector<common_arg *> sparam_options;
    std::vector<common_arg *> specific_options;

    for (auto & opt : ctx_arg.options) {
        if (opt.is_sparam) {
            sparam_options.push_back(&opt);
        } else if (opt.in_example(ctx_arg.ex)) {
            specific_options.push_back(&opt);
        } else {
            common_options.push_back(&opt);
        }
    }

    printf("_llama_completions() {\n");
    printf("    local cur prev opts\n");
    printf("    COMPREPLY=()\n");
    printf("    cur=\"${COMP_WORDS[COMP_CWORD]}\"\n");
    printf("    prev=\"${COMP_WORDS[COMP_CWORD-1]}\"\n\n");

    printf("    opts=\"");
    auto print_options = [](const std::vector<common_arg *> & options) {
        for (const common_arg * opt : options) {
            for (const char * arg : opt->args) {
                printf("%s ", arg);
            }
        }
    };

    print_options(common_options);
    print_options(sparam_options);
    print_options(specific_options);
    printf("\"\n\n");

    printf("    case \"$prev\" in\n");
    printf("        --model)\n");
    printf("            COMPREPLY=( $(compgen -f -X '!*.gguf' -- \"$cur\") $(compgen -d -- \"$cur\") )\n");
    printf("            return 0\n");
    printf("            ;;\n");
    printf("        --grammar-file)\n");
    printf("            COMPREPLY=( $(compgen -f -X '!*.gbnf' -- \"$cur\") $(compgen -d -- \"$cur\") )\n");
    printf("            return 0\n");
    printf("            ;;\n");
    printf("        --chat-template-file)\n");
    printf("            COMPREPLY=( $(compgen -f -X '!*.jinja' -- \"$cur\") $(compgen -d -- \"$cur\") )\n");
    printf("            return 0\n");
    printf("            ;;\n");
    printf("        *)\n");
    printf("            COMPREPLY=( $(compgen -W \"${opts}\" -- \"$cur\") )\n");
    printf("            return 0\n");
    printf("            ;;\n");
    printf("    esac\n");
    printf("}\n\n");

    std::set<std::string> executables = {
        "llama-batched",
        "llama-batched-bench",
        "llama-bench",
        "llama-cli",
        "llama-convert-llama2c-to-ggml",
        "llama-cvector-generator",
        "llama-embedding",
        "llama-eval-callback",
        "llama-export-lora",
        "llama-gen-docs",
        "llama-gguf",
        "llama-gguf-hash",
        "llama-gguf-split",
        "llama-gritlm",
        "llama-imatrix",
        "llama-infill",
        "llama-mtmd-cli",
        "llama-llava-clip-quantize-cli",
        "llama-lookahead",
        "llama-lookup",
        "llama-lookup-create",
        "llama-lookup-merge",
        "llama-lookup-stats",
        "llama-parallel",
        "llama-passkey",
        "llama-perplexity",
        "llama-q8dot",
        "llama-quantize",
        "llama-qwen2vl-cli",
        "llama-retrieval",
        "llama-run",
        "llama-save-load-state",
        "llama-server",
        "llama-simple",
        "llama-simple-chat",
        "llama-speculative",
        "llama-speculative-simple",
        "llama-tokenize",
        "llama-tts",
        "llama-vdot"
    };

    for (const auto& exe : executables) {
        printf("complete -F _llama_completions %s\n", exe.c_str());
    }
}